

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::MinMaxState<duckdb::interval_t>,duckdb::interval_t,duckdb::MinOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  interval_t *piVar2;
  int64_t iVar3;
  data_ptr_t pdVar4;
  ulong uVar5;
  int64_t iVar6;
  sel_t *psVar7;
  undefined8 uVar8;
  ulong uVar9;
  int64_t *piVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  interval_t input_00;
  interval_t input_01;
  interval_t input_02;
  interval_t input_03;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar4 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar14 = 0;
      uVar11 = 0;
      do {
        puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar12 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar12 = count;
          }
LAB_012a1207:
          uVar9 = uVar11;
          if (uVar11 < uVar12) {
            piVar10 = (int64_t *)(pdVar4 + uVar11 * 0x10 + 8);
            do {
              iVar3 = piVar10[-1];
              iVar6 = *piVar10;
              if (state[0x10] == '\0') {
                *(int64_t *)state = iVar3;
                *(int64_t *)(state + 8) = iVar6;
                state[0x10] = '\x01';
              }
              else {
                input_01.micros = iVar6;
                input_01.months = (int)iVar3;
                input_01.days = (int)((ulong)iVar3 >> 0x20);
                MinOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
                          ((MinMaxState<duckdb::interval_t> *)state,input_01,aggr_input_data);
              }
              uVar11 = uVar11 + 1;
              piVar10 = piVar10 + 2;
              uVar9 = uVar12;
            } while (uVar12 != uVar11);
          }
        }
        else {
          uVar5 = puVar1[uVar14];
          uVar12 = uVar11 + 0x40;
          if (count <= uVar11 + 0x40) {
            uVar12 = count;
          }
          if (uVar5 == 0xffffffffffffffff) goto LAB_012a1207;
          uVar9 = uVar12;
          if ((uVar5 != 0) && (uVar9 = uVar11, uVar11 < uVar12)) {
            piVar10 = (int64_t *)(pdVar4 + uVar11 * 0x10 + 8);
            uVar13 = 0;
            do {
              if ((uVar5 >> (uVar13 & 0x3f) & 1) != 0) {
                iVar3 = piVar10[-1];
                iVar6 = *piVar10;
                if (state[0x10] == '\0') {
                  *(int64_t *)state = iVar3;
                  *(int64_t *)(state + 8) = iVar6;
                  state[0x10] = '\x01';
                }
                else {
                  input_00.micros = iVar6;
                  input_00.months = (int)iVar3;
                  input_00.days = (int)((ulong)iVar3 >> 0x20);
                  MinOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
                            ((MinMaxState<duckdb::interval_t> *)state,input_00,aggr_input_data);
                }
              }
              uVar13 = uVar13 + 1;
              piVar10 = piVar10 + 2;
              uVar9 = uVar12;
            } while (uVar12 - uVar11 != uVar13);
          }
        }
        uVar11 = uVar9;
        uVar14 = uVar14 + 1;
      } while (uVar14 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      piVar2 = (interval_t *)input->data;
      iVar3 = piVar2->micros;
      if (state[0x10] != '\0') {
        MinOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
                  ((MinMaxState<duckdb::interval_t> *)state,*piVar2,aggr_input_data);
        return;
      }
      *(undefined8 *)state = *(undefined8 *)piVar2;
      *(int64_t *)(state + 8) = iVar3;
      state[0x10] = '\x01';
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar7 = (local_78.sel)->sel_vector;
        uVar11 = 0;
        do {
          uVar14 = uVar11;
          if (psVar7 != (sel_t *)0x0) {
            uVar14 = (ulong)psVar7[uVar11];
          }
          uVar8 = *(undefined8 *)(local_78.data + uVar14 * 0x10);
          iVar3 = *(int64_t *)(local_78.data + uVar14 * 0x10 + 8);
          if (state[0x10] == '\0') {
            *(undefined8 *)state = uVar8;
            *(int64_t *)(state + 8) = iVar3;
            state[0x10] = '\x01';
          }
          else {
            input_03.micros = iVar3;
            input_03.months = (int)uVar8;
            input_03.days = (int)((ulong)uVar8 >> 0x20);
            MinOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
                      ((MinMaxState<duckdb::interval_t> *)state,input_03,aggr_input_data);
          }
          uVar11 = uVar11 + 1;
        } while (count != uVar11);
      }
    }
    else if (count != 0) {
      psVar7 = (local_78.sel)->sel_vector;
      uVar11 = 0;
      do {
        uVar14 = uVar11;
        if (psVar7 != (sel_t *)0x0) {
          uVar14 = (ulong)psVar7[uVar11];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar14 >> 6]
             >> (uVar14 & 0x3f) & 1) != 0)) {
          uVar8 = *(undefined8 *)(local_78.data + uVar14 * 0x10);
          iVar3 = *(int64_t *)(local_78.data + uVar14 * 0x10 + 8);
          if (state[0x10] == '\0') {
            *(undefined8 *)state = uVar8;
            *(int64_t *)(state + 8) = iVar3;
            state[0x10] = '\x01';
          }
          else {
            input_02.micros = iVar3;
            input_02.months = (int)uVar8;
            input_02.days = (int)((ulong)uVar8 >> 0x20);
            MinOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
                      ((MinMaxState<duckdb::interval_t> *)state,input_02,aggr_input_data);
          }
        }
        uVar11 = uVar11 + 1;
      } while (count != uVar11);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}